

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goesproc.cc
# Opt level: O1

int main(int argc,char **argv)

{
  Handler *config_00;
  _func_int ***ppp_Var1;
  int iVar2;
  GOESRImageHandler *pGVar3;
  _Head_base<0UL,_PacketReader_*,_false> this;
  ostream *poVar4;
  string *psVar5;
  pointer pHVar6;
  char **in_RSI;
  int in_EDI;
  unique_ptr<PacketReader,_std::default_delete<PacketReader>_> reader;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  handlers;
  shared_ptr<FileWriter> fileWriter;
  PacketProcessor p;
  Options opts;
  Config config;
  _Head_base<0UL,_PacketReader_*,_false> local_1f0;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  local_1e8;
  shared_ptr<FileWriter> local_1c8;
  PacketProcessor local_1b8;
  int local_16c;
  char **local_168;
  Options local_160;
  Config local_e0;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  local_68;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  local_48;
  
  local_16c = in_EDI;
  local_168 = in_RSI;
  setenv("TZ","",1);
  parseOptions(&local_160,&local_16c,&local_168);
  Config::load(&local_e0,&local_160.config);
  if (local_e0.ok == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid configuration: ",0x17);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_e0.error._M_dataplus._M_p,
                        local_e0.error._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar4);
LAB_0016c6ba:
    exit(1);
  }
  util::mkdirp(&local_160.out);
  local_1c8.super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<FileWriter,std::allocator<FileWriter>,std::__cxx11::string&>
            (&local_1c8.super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (FileWriter **)&local_1c8,(allocator<FileWriter> *)&local_1b8,&local_160.out);
  if (local_160.force == true) {
    (local_1c8.super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->force_ = true;
  }
  local_1e8.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_e0.handlers.super__Vector_base<Config::Handler,_std::allocator<Config::Handler>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_e0.handlers.super__Vector_base<Config::Handler,_std::allocator<Config::Handler>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_0016c37a:
    if (local_160.mode == PACKET) {
      local_48.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_1e8.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1e8.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_48.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1e8.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1e8.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      PacketProcessor::PacketProcessor(&local_1b8,&local_48);
      std::
      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ::~vector(&local_48);
      local_1f0._M_head_impl = (PacketReader *)0x0;
      if (local_160.subscribe._M_string_length == 0) {
        this._M_head_impl = (PacketReader *)operator_new(0x228);
        FileReader::FileReader((FileReader *)this._M_head_impl,&local_160.paths);
      }
      else {
        this._M_head_impl = (PacketReader *)operator_new(0x10);
        NanomsgReader::NanomsgReader((NanomsgReader *)this._M_head_impl,&local_160.subscribe);
      }
      if (local_1f0._M_head_impl != (PacketReader *)0x0) {
        ppp_Var1 = &(local_1f0._M_head_impl)->_vptr_PacketReader;
        local_1f0._M_head_impl = this._M_head_impl;
        (*(*ppp_Var1)[1])();
        this._M_head_impl = local_1f0._M_head_impl;
      }
      local_1f0._M_head_impl = this._M_head_impl;
      iVar2 = fileno(_stdout);
      iVar2 = isatty(iVar2);
      PacketProcessor::run
                (&local_1b8,
                 (unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)&local_1f0,
                 iVar2 != 0);
      if ((FileReader *)local_1f0._M_head_impl != (FileReader *)0x0) {
        (*((PacketReader *)&(local_1f0._M_head_impl)->_vptr_PacketReader)->_vptr_PacketReader[1])();
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
                   *)&local_1b8.assembler_);
      std::
      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ::~vector(&local_1b8.handlers_);
    }
    if (local_160.mode == LRIT) {
      local_68.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_1e8.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_68.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1e8.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1e8.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1e8.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      LRITProcessor::LRITProcessor((LRITProcessor *)&local_1b8,&local_68);
      std::
      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ::~vector(&local_68);
      LRITProcessor::run((LRITProcessor *)&local_1b8,local_16c,local_168);
      std::
      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ::~vector(&local_1b8.handlers_);
    }
    std::
    vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
    ::~vector(&local_1e8);
    if (local_1c8.super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_e0.json_._M_h);
    std::vector<Config::Handler,_std::allocator<Config::Handler>_>::~vector(&local_e0.handlers);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.error._M_dataplus._M_p != &local_e0.error.field_2) {
      operator_delete(local_e0.error._M_dataplus._M_p,
                      local_e0.error.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_160.paths);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.out._M_dataplus._M_p != &local_160.out.field_2) {
      operator_delete(local_160.out._M_dataplus._M_p,local_160.out.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.subscribe._M_dataplus._M_p != &local_160.subscribe.field_2) {
      operator_delete(local_160.subscribe._M_dataplus._M_p,
                      local_160.subscribe.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.config._M_dataplus._M_p != &local_160.config.field_2) {
      operator_delete(local_160.config._M_dataplus._M_p,
                      local_160.config.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  psVar5 = &(local_e0.handlers.super__Vector_base<Config::Handler,_std::allocator<Config::Handler>_>
             ._M_impl.super__Vector_impl_data._M_start)->origin;
LAB_0016c0ae:
  config_00 = (Handler *)(psVar5 + -1);
  iVar2 = std::__cxx11::string::compare((char *)config_00);
  if (iVar2 == 0) {
    iVar2 = std::__cxx11::string::compare((char *)psVar5);
    if ((((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)psVar5), iVar2 == 0)) ||
        (iVar2 = std::__cxx11::string::compare((char *)psVar5), iVar2 == 0)) ||
       (iVar2 = std::__cxx11::string::compare((char *)psVar5), iVar2 == 0)) {
      pGVar3 = (GOESRImageHandler *)operator_new(0x290);
      GOESRImageHandler::GOESRImageHandler(pGVar3,config_00,&local_1c8);
      local_1b8.handlers_.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar3;
      std::
      vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
      ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                  *)&local_1e8,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_1b8);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar2 == 0) {
        pGVar3 = (GOESRImageHandler *)operator_new(0x1f8);
        NWSImageHandler::NWSImageHandler((NWSImageHandler *)pGVar3,config_00,&local_1c8);
        local_1b8.handlers_.
        super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar3;
        std::
        vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
        ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                  ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                    *)&local_1e8,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_1b8);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)psVar5);
        if (iVar2 == 0) {
          pGVar3 = (GOESRImageHandler *)operator_new(0x250);
          Himawari8ImageHandler::Himawari8ImageHandler
                    ((Himawari8ImageHandler *)pGVar3,config_00,&local_1c8);
          local_1b8.handlers_.
          super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar3;
          std::
          vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
          ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                    ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                      *)&local_1e8,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_1b8)
          ;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)psVar5);
          if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)psVar5), iVar2 != 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Invalid image handler origin: ",0x1e);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,
                                psVar5->_M_string_length);
            std::endl<char,std::char_traits<char>>(poVar4);
            goto LAB_0016c6ba;
          }
          pGVar3 = (GOESRImageHandler *)operator_new(600);
          GOESNImageHandler::GOESNImageHandler((GOESNImageHandler *)pGVar3,config_00,&local_1c8);
          local_1b8.handlers_.
          super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar3;
          std::
          vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
          ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                    ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                      *)&local_1e8,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_1b8)
          ;
        }
      }
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)config_00);
    if (iVar2 == 0) {
      pGVar3 = (GOESRImageHandler *)operator_new(0x1f8);
      EMWINHandler::EMWINHandler((EMWINHandler *)pGVar3,config_00,&local_1c8);
      local_1b8.handlers_.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar3;
      std::
      vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
      ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                  *)&local_1e8,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_1b8);
      goto LAB_0016c2e5;
    }
    iVar2 = std::__cxx11::string::compare((char *)config_00);
    if (iVar2 == 0) goto LAB_0016c2f9;
    iVar2 = std::__cxx11::string::compare((char *)config_00);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Invalid handler type: ",0x16);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(((Handler *)(psVar5 + -1))->type)._M_dataplus._M_p,
                          (((Handler *)(psVar5 + -1))->type)._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_0016c6ba;
    }
    iVar2 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar2 == 0) {
      pGVar3 = (GOESRImageHandler *)operator_new(0x1f8);
      NWSTextHandler::NWSTextHandler((NWSTextHandler *)pGVar3,config_00,&local_1c8);
      local_1b8.handlers_.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar3;
      std::
      vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
      ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                  *)&local_1e8,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_1b8);
      goto LAB_0016c2e5;
    }
    iVar2 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Invalid text handler product: ",0x1e);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length)
      ;
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_0016c6ba;
    }
    pGVar3 = (GOESRImageHandler *)operator_new(0x1f8);
    TextHandler::TextHandler((TextHandler *)pGVar3,config_00,&local_1c8);
    local_1b8.handlers_.
    super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar3;
    std::
    vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
    ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
              ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                *)&local_1e8,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_1b8);
  }
LAB_0016c2e5:
  if ((GOESRImageHandler *)
      local_1b8.handlers_.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (GOESRImageHandler *)0x0) {
    operator_delete(local_1b8.handlers_.
                    super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,8);
  }
LAB_0016c2f9:
  pHVar6 = (pointer)(psVar5 + 0xe);
  psVar5 = psVar5 + 0xf;
  if (pHVar6 == local_e0.handlers.
                super__Vector_base<Config::Handler,_std::allocator<Config::Handler>_>._M_impl.
                super__Vector_impl_data._M_finish) goto LAB_0016c37a;
  goto LAB_0016c0ae;
}

Assistant:

int main(int argc, char** argv) {
  // Dealing with time zones is a PITA even if you only care about UTC.
  // Since this is not a library we can get away with the following...
  setenv("TZ", "", 1);

  auto opts = parseOptions(argc, argv);
  auto config = Config::load(opts.config);
  if (!config.ok) {
    std::cerr << "Invalid configuration: " << config.error << std::endl;
    exit(1);
  }

  // Make sure output directory exists
  mkdirp(opts.out);

  // Handlers share a file writer instance
  auto fileWriter = std::make_shared<FileWriter>(opts.out);
  if (opts.force) {
    fileWriter->setForce(true);
  }

  // Construct list of file handlers
  std::vector<std::unique_ptr<Handler> > handlers;
  for (const auto& handler: config.handlers) {
    if (handler.type == "image") {
      const auto& origin = handler.origin;
      if (origin == "goes16" || origin == "goes17" || origin == "goes18" || origin == "goes19") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new GOESRImageHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "nws") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new NWSImageHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "himawari8") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new Himawari8ImageHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "goes13" || origin == "goes15") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new GOESNImageHandler(handler, fileWriter)));
        continue;
      }

      std::cerr << "Invalid image handler origin: " << handler.origin << std::endl;
      exit(1);
    } else if (handler.type == "emwin") {
      handlers.push_back(
        std::unique_ptr<Handler>(
          new EMWINHandler(handler, fileWriter)));
    } else if (handler.type == "dcs") {
      // TODO
    } else if (handler.type == "text") {
      const auto& origin = handler.origin;
      if (origin == "nws") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new NWSTextHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "other") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new TextHandler(handler, fileWriter)));
        continue;
      }

      std::cerr << "Invalid text handler product: " << handler.origin << std::endl;
      exit(1);
    } else {
      std::cerr << "Invalid handler type: " << handler.type << std::endl;
      exit(1);
    }
  }

  if (opts.mode == ProcessMode::PACKET) {
    PacketProcessor p(std::move(handlers));
    std::unique_ptr<PacketReader> reader;

    // Either use subscriber or read packets from files
    if (opts.subscribe.size() > 0) {
      reader = std::make_unique<NanomsgReader>(opts.subscribe);
    } else {
      reader = std::make_unique<FileReader>(opts.paths);
    }

    // Run in verbose mode when stdout is a TTY.
    bool verbose = isatty(fileno(stdout));
    p.run(reader, verbose);
  }

  if (opts.mode == ProcessMode::LRIT) {
    LRITProcessor p(std::move(handlers));
    p.run(argc, argv);
  }
}